

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_variable(Parser *parser,Modifier *modifier)

{
  Kind KVar1;
  Token *name;
  uint uVar2;
  Type *type;
  VarTerm *pVVar3;
  void *expr;
  bool bVar4;
  
  name = parser->token;
  expect(parser,ID);
  break_newline(parser);
  KVar1 = parser->token->kind;
  if (KVar1 == EQ) {
    bVar4 = true;
LAB_001044b1:
    type = (Type *)0x0;
  }
  else {
    if (KVar1 != COLON) {
      break_newline(parser);
      bVar4 = false;
      log_debug(
               "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:182"
               );
      log_code(parser->lexer->source,parser->token->row_pos,parser->token->col_pos,
               "Variable type is ambiguous","");
      goto LAB_001044b1;
    }
    bmove(parser);
    uVar2 = parser->token->kind - STATIC;
    if ((uVar2 < 7) && (uVar2 != 5)) {
      bmove(parser);
    }
    else {
      expect(parser,ID);
    }
    type = new_type(parser->token);
    bVar4 = parser->token->kind == EQ;
  }
  pVVar3 = new_var_term(name,(void *)0x0,type,modifier);
  uVar2 = parser->token->kind - LE_EQ;
  if ((uVar2 < 0x18) && ((0xf0fc13U >> (uVar2 & 0x1f) & 1) != 0)) {
    if (!bVar4) goto LAB_001044eb;
  }
  else if (!bVar4) {
    return pVVar3;
  }
  bmove(parser);
LAB_001044eb:
  expr = parse_logic(parser);
  pVVar3 = new_var_term(name,expr,type,modifier);
  return pVVar3;
}

Assistant:

void *parse_variable(Parser *parser, Modifier *modifier) {
    Token *tok = token(parser);
    expect(parser, ID);
    break_newline(parser);
    Kind kid = token(parser)->kind;
    Type *var_type = NULL;
    if (kid == COLON) {
        bmove(parser);
        if (is_basic_type(token(parser))) {
            bmove(parser);
        } else {
            expect(parser, ID);
        }
        var_type = new_type(token(parser));
        kid = token(parser)->kind;
    } else if (kid != EQ) {
        break_newline(parser);
        parse_error(parser, "Variable type is ambiguous", "");
    }
    void *term = new_var_term(tok, NULL, var_type, modifier);
    if (is_operator(token(parser)) || kid == EQ) {
        if (kid == EQ) {
            bmove(parser);
        }
        term = new_var_term(tok, parse_expr(parser), var_type, modifier);
    }
    return term;
}